

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

Ptr<Catch::CumulativeReporterBase::SectionNode> * __thiscall
Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>::operator=
          (Ptr<Catch::CumulativeReporterBase::SectionNode> *this,
          Ptr<Catch::CumulativeReporterBase::SectionNode> *other)

{
  SectionNode *pSVar1;
  Ptr<Catch::CumulativeReporterBase::SectionNode> local_18;
  
  pSVar1 = other->m_p;
  if (pSVar1 != (SectionNode *)0x0) {
    (*(pSVar1->super_SharedImpl<Catch::IShared>).super_IShared.super_NonCopyable._vptr_NonCopyable
      [2])(pSVar1);
  }
  local_18 = (Ptr<Catch::CumulativeReporterBase::SectionNode>)this->m_p;
  this->m_p = pSVar1;
  ~Ptr(&local_18);
  return this;
}

Assistant:

Ptr& operator = ( Ptr const& other ){
            Ptr temp( other );
            swap( temp );
            return *this;
        }